

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O0

void __thiscall SpinLock::SlowLock(SpinLock *this)

{
  __atomic_base<int> _Var1;
  int local_98;
  __atomic_base<int> local_94;
  int lock_wait_call_count;
  int lock_value;
  SpinLock *this_local;
  __atomic_base<int> *local_80;
  SpinLock *local_78;
  undefined4 local_70;
  undefined4 local_6c;
  __atomic_base<int> *local_68;
  SpinLock *local_60;
  bool local_51;
  undefined4 local_50;
  memory_order local_4c;
  undefined4 local_48;
  undefined4 local_44;
  __atomic_base<int> *local_40;
  SpinLock *local_38;
  undefined1 local_29;
  undefined4 local_28;
  memory_order local_24;
  undefined4 local_20;
  undefined4 local_1c;
  __atomic_base<int> *local_18;
  SpinLock *local_10;
  
  _lock_wait_call_count = this;
  local_94._M_i = SpinLoop(this);
  local_98 = 0;
  do {
    while( true ) {
      if (local_94._M_i == 0) {
        return;
      }
      if (local_94._M_i == 1) break;
LAB_00144661:
      local_98 = local_98 + 1;
      ::base::internal::SpinLockDelay(&this->lockword_,local_94._M_i,local_98);
      local_94._M_i = SpinLoop(this);
    }
    local_6c = 2;
    local_70 = 2;
    local_68 = &local_94;
    local_60 = this;
    local_4c = std::__cmpexch_failure_order(memory_order_acquire);
    local_44 = 2;
    local_48 = 2;
    local_50 = 2;
    switch(0x143b31) {
    default:
      if (local_4c - memory_order_consume < 2) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else if (local_4c == memory_order_seq_cst) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      break;
    case 2:
      if (local_4c - memory_order_consume < 2) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else if (local_4c == memory_order_seq_cst) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      break;
    case 3:
      if (local_4c - memory_order_consume < 2) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else if (local_4c == memory_order_seq_cst) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      break;
    case 4:
      if (local_4c - memory_order_consume < 2) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else if (local_4c == memory_order_seq_cst) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_51 = local_94._M_i == _Var1._M_i;
        if (local_51) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!local_51) {
          local_94._M_i = _Var1._M_i;
        }
      }
    }
    local_40 = &local_94;
    local_38 = this;
    if (local_94._M_i == 1) {
      local_94._M_i = 2;
      goto LAB_00144661;
    }
    if (local_94._M_i != 0) goto LAB_00144661;
    this_local._4_4_ = 2;
    this_local._0_4_ = 2;
    local_80 = &local_94;
    local_78 = this;
    local_24 = std::__cmpexch_failure_order(memory_order_acquire);
    local_1c = 2;
    local_20 = 2;
    local_28 = 2;
    local_18 = &local_94;
    local_10 = this;
    switch(0x144150) {
    default:
      if (local_24 - memory_order_consume < 2) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else if (local_24 == memory_order_seq_cst) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      break;
    case 2:
      if (local_24 - memory_order_consume < 2) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else if (local_24 == memory_order_seq_cst) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      break;
    case 3:
      if (local_24 - memory_order_consume < 2) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else if (local_24 == memory_order_seq_cst) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      break;
    case 4:
      if (local_24 - memory_order_consume < 2) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else if (local_24 == memory_order_seq_cst) {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
      else {
        LOCK();
        _Var1._M_i = (this->lockword_).super___atomic_base<int>._M_i;
        local_29 = local_94._M_i == _Var1._M_i;
        if ((bool)local_29) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          _Var1._M_i = local_94._M_i;
        }
        UNLOCK();
        if (!(bool)local_29) {
          local_94._M_i = _Var1._M_i;
        }
      }
    }
  } while( true );
}

Assistant:

void SpinLock::SlowLock() {
  int lock_value = SpinLoop();

  int lock_wait_call_count = 0;
  while (lock_value != kSpinLockFree) {
    // If the lock is currently held, but not marked as having a sleeper, mark
    // it as having a sleeper.
    if (lock_value == kSpinLockHeld) {
      // Here, just "mark" that the thread is going to sleep.  Don't
      // store the lock wait time in the lock as that will cause the
      // current lock owner to think it experienced contention. Note,
      // compare_exchange updates lock_value with previous value of
      // lock word.
      lockword_.compare_exchange_strong(lock_value, kSpinLockSleeper,
                                        std::memory_order_acquire);
      if (lock_value == kSpinLockHeld) {
        // Successfully transitioned to kSpinLockSleeper.  Pass
        // kSpinLockSleeper to the SpinLockDelay routine to properly indicate
        // the last lock_value observed.
        lock_value = kSpinLockSleeper;
      } else if (lock_value == kSpinLockFree) {
        // Lock is free again, so try and acquire it before sleeping.  The
        // new lock state will be the number of cycles this thread waited if
        // this thread obtains the lock.
        lockword_.compare_exchange_strong(lock_value, kSpinLockSleeper, std::memory_order_acquire);
        continue;  // skip the delay at the end of the loop
      }
    }

    // Wait for an OS specific delay.
    base::internal::SpinLockDelay(&lockword_, lock_value,
                                  ++lock_wait_call_count);
    // Spin again after returning from the wait routine to give this thread
    // some chance of obtaining the lock.
    lock_value = SpinLoop();
  }
}